

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# polymer.cpp
# Opt level: O0

void __thiscall MobileElementManager::Delete(MobileElementManager *this,int index)

{
  bool bVar1;
  reference pvVar2;
  reference this_00;
  element_type *this_01;
  string *__lhs;
  size_type sVar3;
  size_type sVar4;
  runtime_error *this_02;
  __normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_> local_50;
  __normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_> local_48;
  const_iterator local_40;
  pair<std::shared_ptr<MobileElement>,_std::shared_ptr<Polymer>_> *local_38;
  __normal_iterator<std::pair<std::shared_ptr<MobileElement>,_std::shared_ptr<Polymer>_>_*,_std::vector<std::pair<std::shared_ptr<MobileElement>,_std::shared_ptr<Polymer>_>,_std::allocator<std::pair<std::shared_ptr<MobileElement>,_std::shared_ptr<Polymer>_>_>_>_>
  local_30;
  __normal_iterator<std::pair<std::shared_ptr<MobileElement>,_std::shared_ptr<Polymer>_>_*,_std::vector<std::pair<std::shared_ptr<MobileElement>,_std::shared_ptr<Polymer>_>,_std::allocator<std::pair<std::shared_ptr<MobileElement>,_std::shared_ptr<Polymer>_>_>_>_>
  local_28;
  const_iterator local_20;
  int local_14;
  MobileElementManager *pMStack_10;
  int index_local;
  MobileElementManager *this_local;
  
  local_14 = index;
  pMStack_10 = this;
  pvVar2 = std::vector<double,_std::allocator<double>_>::operator[](&this->prop_list_,(long)index);
  this->prop_sum_ = this->prop_sum_ - *pvVar2;
  this_00 = std::
            vector<std::pair<std::shared_ptr<MobileElement>,_std::shared_ptr<Polymer>_>,_std::allocator<std::pair<std::shared_ptr<MobileElement>,_std::shared_ptr<Polymer>_>_>_>
            ::operator[](&this->polymerases_,(long)local_14);
  this_01 = std::__shared_ptr_access<MobileElement,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
            operator->((__shared_ptr_access<MobileElement,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                        *)this_00);
  __lhs = MobileElement::name_abi_cxx11_(this_01);
  bVar1 = std::operator!=(__lhs,"__rnase");
  if (bVar1) {
    this->pol_count_ = this->pol_count_ + -1;
  }
  local_30._M_current =
       (pair<std::shared_ptr<MobileElement>,_std::shared_ptr<Polymer>_> *)
       std::
       vector<std::pair<std::shared_ptr<MobileElement>,_std::shared_ptr<Polymer>_>,_std::allocator<std::pair<std::shared_ptr<MobileElement>,_std::shared_ptr<Polymer>_>_>_>
       ::begin(&this->polymerases_);
  local_28 = __gnu_cxx::
             __normal_iterator<std::pair<std::shared_ptr<MobileElement>,_std::shared_ptr<Polymer>_>_*,_std::vector<std::pair<std::shared_ptr<MobileElement>,_std::shared_ptr<Polymer>_>,_std::allocator<std::pair<std::shared_ptr<MobileElement>,_std::shared_ptr<Polymer>_>_>_>_>
             ::operator+(&local_30,(long)local_14);
  __gnu_cxx::
  __normal_iterator<std::pair<std::shared_ptr<MobileElement>,std::shared_ptr<Polymer>>const*,std::vector<std::pair<std::shared_ptr<MobileElement>,std::shared_ptr<Polymer>>,std::allocator<std::pair<std::shared_ptr<MobileElement>,std::shared_ptr<Polymer>>>>>
  ::__normal_iterator<std::pair<std::shared_ptr<MobileElement>,std::shared_ptr<Polymer>>*>
            ((__normal_iterator<std::pair<std::shared_ptr<MobileElement>,std::shared_ptr<Polymer>>const*,std::vector<std::pair<std::shared_ptr<MobileElement>,std::shared_ptr<Polymer>>,std::allocator<std::pair<std::shared_ptr<MobileElement>,std::shared_ptr<Polymer>>>>>
              *)&local_20,&local_28);
  local_38 = (pair<std::shared_ptr<MobileElement>,_std::shared_ptr<Polymer>_> *)
             std::
             vector<std::pair<std::shared_ptr<MobileElement>,_std::shared_ptr<Polymer>_>,_std::allocator<std::pair<std::shared_ptr<MobileElement>,_std::shared_ptr<Polymer>_>_>_>
             ::erase(&this->polymerases_,local_20);
  local_50._M_current =
       (double *)std::vector<double,_std::allocator<double>_>::begin(&this->prop_list_);
  local_48 = __gnu_cxx::__normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_>::
             operator+(&local_50,(long)local_14);
  __gnu_cxx::__normal_iterator<double_const*,std::vector<double,std::allocator<double>>>::
  __normal_iterator<double*>
            ((__normal_iterator<double_const*,std::vector<double,std::allocator<double>>> *)
             &local_40,&local_48);
  std::vector<double,_std::allocator<double>_>::erase(&this->prop_list_,local_40);
  sVar3 = std::vector<double,_std::allocator<double>_>::size(&this->prop_list_);
  sVar4 = std::
          vector<std::pair<std::shared_ptr<MobileElement>,_std::shared_ptr<Polymer>_>,_std::allocator<std::pair<std::shared_ptr<MobileElement>,_std::shared_ptr<Polymer>_>_>_>
          ::size(&this->polymerases_);
  if (sVar3 == sVar4) {
    return;
  }
  this_02 = (runtime_error *)__cxa_allocate_exception(0x10);
  std::runtime_error::runtime_error(this_02,"Prop list not correct size.");
  __cxa_throw(this_02,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

void MobileElementManager::Delete(int index) {
  prop_sum_ -= prop_list_[index];
  // Keep running count of non-RNAse mobile elements
  if (polymerases_[index].first->name() != "__rnase") {
    pol_count_ -= 1;
  }
  polymerases_.erase(polymerases_.begin() + index);
  prop_list_.erase(prop_list_.begin() + index);
  if (prop_list_.size() != polymerases_.size()) {
    throw std::runtime_error("Prop list not correct size.");
  }
}